

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# advancing_front.cc
# Opt level: O1

Node * __thiscall p2t::AdvancingFront::LocateNode(AdvancingFront *this,double x)

{
  Node *pNVar1;
  
  pNVar1 = this->search_node_;
  if (pNVar1->value <= x) {
    while (pNVar1 = pNVar1->next, pNVar1 != (Node *)0x0) {
      if (x < pNVar1->value) {
        this->search_node_ = pNVar1->prev;
        return pNVar1->prev;
      }
    }
  }
  else {
    while( true ) {
      pNVar1 = pNVar1->prev;
      if (pNVar1 == (Node *)0x0) break;
      if (pNVar1->value <= x) {
        this->search_node_ = pNVar1;
        return pNVar1;
      }
    }
  }
  return (Node *)0x0;
}

Assistant:

Node* AdvancingFront::LocateNode(double x)
{
  Node* node = search_node_;

  if (x < node->value) {
    while ((node = node->prev) != NULL) {
      if (x >= node->value) {
        search_node_ = node;
        return node;
      }
    }
  } else {
    while ((node = node->next) != NULL) {
      if (x < node->value) {
        search_node_ = node->prev;
        return node->prev;
      }
    }
  }
  return NULL;
}